

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

void deqp::gls::BuiltinPrecisionTests::Traits<float>::doPrintIVal
               (FloatFormat *fmt,Interval *ival,ostream *os)

{
  string local_30;
  
  tcu::FloatFormat::intervalToHex_abi_cxx11_(&local_30,fmt,ival);
  std::operator<<(os,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

static void			doPrintIVal		(const FloatFormat&	fmt,
										 const Interval&	ival,
										 ostream&			os)
	{
		os << fmt.intervalToHex(ival);
	}